

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O0

void __thiscall
TPZMatRed<float,_TPZVerySparseMatrix<float>_>::TPZMatRed
          (TPZMatRed<float,_TPZVerySparseMatrix<float>_> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *columns;
  TPZVerySparseMatrix<float> *this_00;
  TPZRegisterClassId *rows;
  TPZRegisterClassId *cols;
  int64_t in_stack_ffffffffffffffa8;
  TPZAutoPointer<TPZMatrixSolver<float>_> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZMatrix<float> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  TPZFMatrix<float> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZMatRed<float,TPZVerySparseMatrix<float>>>(in_RDI,0x21);
  TPZMatrix<float>::TPZMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int64_t)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR__TPZMatRed_02431cd8;
  columns = in_RDI + 0x20;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffffb0);
  this_00 = (TPZVerySparseMatrix<float> *)(in_RDI + 0x28);
  TPZAutoPointer<TPZMatrixSolver<float>_>::TPZAutoPointer(in_stack_ffffffffffffffb0);
  rows = in_RDI + 0x30;
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int64_t)columns);
  cols = in_RDI + 0xc0;
  TPZVerySparseMatrix<float>::TPZVerySparseMatrix(this_00,(int64_t)rows,(int64_t)cols);
  TPZVerySparseMatrix<float>::TPZVerySparseMatrix(this_00,(int64_t)rows,(int64_t)cols);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int64_t)columns);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int64_t)columns);
  in_RDI[0x291] = (TPZRegisterClassId)0x0;
  in_RDI[0x292] = (TPZRegisterClassId)0x0;
  *(undefined4 *)(in_RDI + 0x294) = 0;
  *(undefined4 *)(in_RDI + 0x298) = 0;
  *(undefined8 *)(in_RDI + 0x280) = 0;
  *(undefined8 *)(in_RDI + 0x288) = 0;
  in_RDI[0x291] = (TPZRegisterClassId)0x0;
  in_RDI[0x290] = (TPZRegisterClassId)0x0;
  in_RDI[0x292] = (TPZRegisterClassId)0x0;
  return;
}

Assistant:

TPZMatRed<TVar,  TSideMatrix>::TPZMatRed () : 
TPZRegisterClassId(&TPZMatRed::ClassId),
TPZMatrix<TVar>( 0, 0 ), fK11(0,0),fK01(0,0),fK10(0,0),fF0(0,0),fF1(0,0), fMaxRigidBodyModes(0), fNumberRigidBodyModes(0)
{
	fDim0=0;
	fDim1=0;
	fK01IsComputed = 0;
	fIsReduced = 0;
    fF0IsComputed = false;
}